

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedShaderImpl::QueryInterface
          (SerializedShaderImpl *this,INTERFACE_ID *IID,IObject **ppInterface)

{
  bool bVar1;
  IObject **ppInterface_local;
  INTERFACE_ID *IID_local;
  SerializedShaderImpl *this_local;
  
  if (ppInterface != (IObject **)0x0) {
    bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_SerializedShader);
    if (((bVar1) || (bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_Shader), bVar1)) ||
       (bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_InternalImpl), bVar1)) {
      *ppInterface = (IObject *)this;
      (*(*ppInterface)->_vptr_IObject[1])();
    }
    else {
      ObjectBase<Diligent::ISerializedShader>::QueryInterface
                (&this->super_ObjectBase<Diligent::ISerializedShader>,IID,ppInterface);
    }
  }
  return;
}

Assistant:

void DILIGENT_CALL_TYPE SerializedShaderImpl::QueryInterface(const INTERFACE_ID& IID, IObject** ppInterface)
{
    if (ppInterface == nullptr)
        return;
    if (IID == IID_SerializedShader || IID == IID_Shader || IID == IID_InternalImpl)
    {
        *ppInterface = this;
        (*ppInterface)->AddRef();
    }
    else
    {
        TBase::QueryInterface(IID, ppInterface);
    }
}